

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bork.cpp
# Opt level: O2

void from_file(string *filename)

{
  undefined1 auVar1 [16];
  string buf;
  context c;
  string local_248 [32];
  ifstream f;
  int aiStack_208 [122];
  
  std::ifstream::ifstream(&f,(string *)filename,_S_in);
  buf._M_dataplus._M_p = (pointer)&buf.field_2;
  buf._M_string_length = 0;
  buf.field_2._M_local_buf[0] = '\0';
  c._M_h._M_buckets = &c._M_h._M_single_bucket;
  c._M_h._M_bucket_count = 1;
  c._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  c._M_h._M_element_count = 0;
  c._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  c._M_h._M_rehash_policy._M_next_resize = 0;
  c._M_h._M_single_bucket = (__node_base_ptr)0x0;
  stdlib::init_stdlib((unordered_map *)&c);
  while (*(int *)((long)aiStack_208 + *(long *)(_f + -0x18)) == 0) {
    read_exp(&f,&buf);
    std::__cxx11::string::string(local_248,(string *)&buf);
    auVar1 = parser::parse(local_248);
    eval::eval(auVar1._0_8_,(thing *)&c,auVar1._8_8_);
    std::__cxx11::string::~string(local_248);
    buf._M_string_length = 0;
    *buf._M_dataplus._M_p = '\0';
  }
  std::ifstream::close();
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_eval::value_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_eval::value_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&c._M_h);
  std::__cxx11::string::~string((string *)&buf);
  std::ifstream::~ifstream(&f);
  return;
}

Assistant:

void from_file(const std::string &filename) {

  std::ifstream f(filename);
  std::string buf;

  context c;
  stdlib::init_stdlib(c);

  while (f.good()) {

    read_exp(f, buf);
    eval::eval(parser::parse(buf), c);
    buf.clear();

  }

  f.close();

}